

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O2

bool __thiscall spvtools::opt::AggressiveDCEPass::ProcessGlobalValues(AggressiveDCEPass *this)

{
  Op OVar1;
  Module *pMVar2;
  pointer ppIVar3;
  pointer ppIVar4;
  bool bVar5;
  bool bVar6;
  uint32_t uVar7;
  uint32_t id;
  CommonDebugInfoInstructions CVar8;
  Instruction *pIVar9;
  ulong uVar10;
  DefUseManager *pDVar11;
  Instruction *pIVar12;
  DebugInfoManager *this_00;
  Operand *__x;
  long lVar13;
  bool bVar14;
  uint32_t i_2;
  uint uVar15;
  Instruction *dbg;
  Instruction **ppIVar16;
  bool bVar17;
  Instruction *inst;
  pointer ppIVar18;
  pointer ppIVar19;
  long lVar20;
  Instruction *entry;
  initializer_list<unsigned_int> init_list;
  uint32_t local_8c;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> new_operands;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> annotations;
  
  bVar17 = false;
  pIVar9 = *(Instruction **)
            ((long)&(((((this->super_MemPass).super_Pass.context_)->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->debugs2_
                    ).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  while (pIVar9 != (Instruction *)0x0) {
    if (pIVar9->opcode_ == OpName) {
      bVar5 = IsTargetDead(this,pIVar9);
      if (bVar5) {
        pIVar9 = IRContext::KillInst((this->super_MemPass).super_Pass.context_,pIVar9);
        bVar17 = true;
      }
      else {
        pIVar12 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        pIVar9 = (Instruction *)0x0;
        if ((pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
          pIVar9 = pIVar12;
        }
      }
    }
    else {
      pIVar9 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if ((pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar9 = (Instruction *)0x0;
      }
    }
  }
  annotations.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  annotations.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  annotations.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar2 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar16 = (Instruction **)
             ((long)&(pMVar2->annotations_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  while (ppIVar4 = annotations.
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
        ppIVar19 = annotations.
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ._M_impl.super__Vector_impl_data._M_start, pIVar9 = *ppIVar16,
        pIVar9 != (Instruction *)
                  ((long)&(pMVar2->annotations_).super_IntrusiveList<spvtools::opt::Instruction> +
                  8U)) {
    new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pIVar9;
    std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
    emplace_back<spvtools::opt::Instruction*>
              ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
               &annotations,(Instruction **)&new_operands);
    ppIVar16 = &(pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  ppIVar3 = annotations.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (annotations.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      annotations.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar20 = (long)annotations.
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)annotations.
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar10 = lVar20 >> 3;
    lVar13 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction**,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<spvtools::opt::(anonymous_namespace)::DecorationLess>>
              (annotations.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
               annotations.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar20 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction**,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__ops::_Iter_comp_iter<spvtools::opt::(anonymous_namespace)::DecorationLess>>
                (ppIVar19,ppIVar4);
      ppIVar19 = annotations.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppIVar3 = annotations.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      ppIVar18 = ppIVar19 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction**,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__ops::_Iter_comp_iter<spvtools::opt::(anonymous_namespace)::DecorationLess>>
                (ppIVar19,ppIVar18);
      for (; ppIVar19 = annotations.
                        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
          ppIVar3 = annotations.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish, ppIVar18 != ppIVar4;
          ppIVar18 = ppIVar18 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction**,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__ops::_Val_comp_iter<spvtools::opt::(anonymous_namespace)::DecorationLess>>
                  (ppIVar18);
      }
    }
  }
  for (; ppIVar19 != ppIVar3; ppIVar19 = ppIVar19 + 1) {
    pIVar9 = *ppIVar19;
    OVar1 = pIVar9->opcode_;
    switch(OVar1) {
    case OpDecorate:
    case OpMemberDecorate:
switchD_004ada0a_caseD_47:
      bVar5 = IsTargetDead(this,pIVar9);
      if (bVar5) goto LAB_004ada47;
      break;
    case OpDecorationGroup:
      pDVar11 = Pass::get_def_use_mgr((Pass *)this);
      uVar7 = analysis::DefUseManager::NumUsers(pDVar11,pIVar9);
      if (uVar7 == 0) goto LAB_004ada47;
      break;
    case OpGroupDecorate:
      bVar5 = true;
      bVar14 = false;
      uVar7 = 1;
      while (uVar7 < (uint)(((long)(pIVar9->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pIVar9->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x30)) {
        pDVar11 = Pass::get_def_use_mgr((Pass *)this);
        id = Instruction::GetSingleWordOperand(pIVar9,uVar7);
        pIVar12 = analysis::DefUseManager::GetDef(pDVar11,id);
        bVar6 = IsLive(this,pIVar12);
        if (bVar6) {
          uVar7 = uVar7 + 1;
          bVar5 = false;
        }
        else {
          Instruction::RemoveOperand(pIVar9,uVar7);
          bVar14 = true;
          bVar17 = true;
        }
      }
      if (bVar5) {
LAB_004adbfd:
        IRContext::KillInst((this->super_MemPass).super_Pass.context_,pIVar9);
        bVar17 = true;
      }
      else if (bVar14) {
        IRContext::UpdateDefUse((this->super_MemPass).super_Pass.context_,pIVar9);
      }
      break;
    case OpGroupMemberDecorate:
      bVar5 = true;
      bVar14 = false;
      uVar15 = 1;
      do {
        while( true ) {
          if ((uint)(((long)(pIVar9->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pIVar9->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x30) <= uVar15) {
            if (bVar5) goto LAB_004adbfd;
            if (bVar14) {
              IRContext::UpdateDefUse((this->super_MemPass).super_Pass.context_,pIVar9);
            }
            goto LAB_004adc11;
          }
          pDVar11 = Pass::get_def_use_mgr((Pass *)this);
          uVar7 = Instruction::GetSingleWordOperand(pIVar9,uVar15);
          pIVar12 = analysis::DefUseManager::GetDef(pDVar11,uVar7);
          bVar6 = IsLive(this,pIVar12);
          if (bVar6) break;
          Instruction::RemoveOperand(pIVar9,uVar15 + 1);
          Instruction::RemoveOperand(pIVar9,uVar15);
          bVar14 = true;
          bVar17 = true;
        }
        uVar15 = uVar15 + 2;
        bVar5 = false;
      } while( true );
    default:
      if (OVar1 - OpDecorateString < 2) goto switchD_004ada0a_caseD_47;
      if (OVar1 != OpDecorateId) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp"
                      ,0x381,"bool spvtools::opt::AggressiveDCEPass::ProcessGlobalValues()");
      }
      bVar5 = IsTargetDead(this,pIVar9);
      if (!bVar5) {
        uVar7 = Instruction::GetSingleWordInOperand(pIVar9,1);
        if (uVar7 == 0x1602) {
          uVar7 = Instruction::GetSingleWordInOperand(pIVar9,2);
          pDVar11 = Pass::get_def_use_mgr((Pass *)this);
          pIVar12 = analysis::DefUseManager::GetDef(pDVar11,uVar7);
          bVar5 = IsLive(this,pIVar12);
          if (!bVar5) goto LAB_004ada47;
        }
        break;
      }
LAB_004ada47:
      IRContext::KillInst((this->super_MemPass).super_Pass.context_,pIVar9);
      bVar17 = true;
    }
LAB_004adc11:
  }
  pMVar2 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar16 = (Instruction **)
             ((long)&(pMVar2->ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction> +
             0x10);
  while (pIVar9 = *ppIVar16,
        pIVar9 != (Instruction *)
                  ((long)&(pMVar2->ext_inst_debuginfo_).
                          super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
    bVar5 = IsLive(this,pIVar9);
    if (!bVar5) {
      CVar8 = Instruction::GetCommonDebugOpcode(pIVar9);
      if (CVar8 == CommonDebugInfoDebugGlobalVariable) {
        uVar7 = Instruction::GetSingleWordOperand(pIVar9,0xc);
        pDVar11 = Pass::get_def_use_mgr((Pass *)this);
        pIVar12 = analysis::DefUseManager::GetDef(pDVar11,uVar7);
        bVar5 = IsLive(this,pIVar12);
        if (!bVar5) {
          IRContext::ForgetUses((this->super_MemPass).super_Pass.context_,pIVar9);
          this_00 = IRContext::get_debug_info_mgr((this->super_MemPass).super_Pass.context_);
          pIVar12 = analysis::DebugInfoManager::GetDebugInfoNone(this_00);
          local_8c = Instruction::result_id(pIVar12);
          init_list._M_len = 1;
          init_list._M_array = &local_8c;
          utils::SmallVector<unsigned_int,_2UL>::SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)&new_operands,init_list);
          Instruction::SetOperand(pIVar9,0xc,(SmallVector<unsigned_int,_2UL> *)&new_operands);
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)&new_operands);
          IRContext::AnalyzeUses((this->super_MemPass).super_Pass.context_,pIVar9);
        }
      }
      else {
        new_operands.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pIVar9;
        std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
        emplace_back<spvtools::opt::Instruction*>
                  ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                    *)&this->to_kill_,(Instruction **)&new_operands);
        bVar17 = true;
      }
    }
    ppIVar16 = &(pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  pMVar2 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar16 = (Instruction **)
             ((long)&(pMVar2->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
  ;
  do {
    pIVar9 = *ppIVar16;
    if (pIVar9 == (Instruction *)
                  ((long)&(pMVar2->types_values_).super_IntrusiveList<spvtools::opt::Instruction> +
                  8U)) {
      if (this->preserve_interface_ == false) {
        pMVar2 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                 .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
        ppIVar16 = (Instruction **)
                   ((long)&(pMVar2->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> +
                   0x10);
        while (pIVar9 = *ppIVar16,
              pIVar9 != (Instruction *)
                        ((long)&(pMVar2->entry_points_).
                                super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
          new_operands.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          new_operands.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          new_operands.
          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (uVar15 = 0; uVar7 = Instruction::NumInOperands(pIVar9), uVar15 < uVar7;
              uVar15 = uVar15 + 1) {
            if (uVar15 < 3) {
LAB_004ade60:
              __x = Instruction::GetInOperand(pIVar9,uVar15);
              std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
              push_back(&new_operands,__x);
            }
            else {
              pDVar11 = Pass::get_def_use_mgr((Pass *)this);
              uVar7 = Instruction::GetSingleWordInOperand(pIVar9,uVar15);
              pIVar12 = analysis::DefUseManager::GetDef(pDVar11,uVar7);
              bVar5 = IsLive(this,pIVar12);
              if (bVar5) goto LAB_004ade60;
            }
          }
          lVar13 = (long)new_operands.
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)new_operands.
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          uVar7 = Instruction::NumInOperands(pIVar9);
          if (lVar13 / 0x30 != (ulong)uVar7) {
            Instruction::SetInOperands(pIVar9,&new_operands);
            pDVar11 = Pass::get_def_use_mgr((Pass *)this);
            analysis::DefUseManager::UpdateDefUse(pDVar11,pIVar9);
          }
          std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                    (&new_operands);
          ppIVar16 = &(pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        }
      }
      std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ::~_Vector_base(&annotations.
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     );
      return bVar17;
    }
    bVar5 = IsLive(this,pIVar9);
    if (!bVar5) {
      if (pIVar9->opcode_ == OpTypeForwardPointer) {
        uVar7 = Instruction::GetSingleWordInOperand(pIVar9,0);
        pDVar11 = Pass::get_def_use_mgr((Pass *)this);
        pIVar12 = analysis::DefUseManager::GetDef(pDVar11,uVar7);
        bVar5 = IsLive(this,pIVar12);
        if (bVar5) goto LAB_004addba;
      }
      new_operands.
      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pIVar9;
      std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
      emplace_back<spvtools::opt::Instruction*>
                ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>> *)
                 &this->to_kill_,(Instruction **)&new_operands);
      bVar17 = true;
    }
LAB_004addba:
    ppIVar16 = &(pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while( true );
}

Assistant:

bool AggressiveDCEPass::ProcessGlobalValues() {
  // Remove debug and annotation statements referencing dead instructions.
  // This must be done before killing the instructions, otherwise there are
  // dead objects in the def/use database.
  bool modified = false;
  Instruction* instruction = &*get_module()->debug2_begin();
  while (instruction) {
    if (instruction->opcode() != spv::Op::OpName) {
      instruction = instruction->NextNode();
      continue;
    }

    if (IsTargetDead(instruction)) {
      instruction = context()->KillInst(instruction);
      modified = true;
    } else {
      instruction = instruction->NextNode();
    }
  }

  // This code removes all unnecessary decorations safely (see #1174). It also
  // does so in a more efficient manner than deleting them only as the targets
  // are deleted.
  std::vector<Instruction*> annotations;
  for (auto& inst : get_module()->annotations()) annotations.push_back(&inst);
  std::sort(annotations.begin(), annotations.end(), DecorationLess());
  for (auto annotation : annotations) {
    switch (annotation->opcode()) {
      case spv::Op::OpDecorate:
      case spv::Op::OpMemberDecorate:
      case spv::Op::OpDecorateStringGOOGLE:
      case spv::Op::OpMemberDecorateStringGOOGLE:
        if (IsTargetDead(annotation)) {
          context()->KillInst(annotation);
          modified = true;
        }
        break;
      case spv::Op::OpDecorateId:
        if (IsTargetDead(annotation)) {
          context()->KillInst(annotation);
          modified = true;
        } else {
          if (spv::Decoration(annotation->GetSingleWordInOperand(1)) ==
              spv::Decoration::HlslCounterBufferGOOGLE) {
            // HlslCounterBuffer will reference an id other than the target.
            // If that id is dead, then the decoration can be removed as well.
            uint32_t counter_buffer_id = annotation->GetSingleWordInOperand(2);
            Instruction* counter_buffer_inst =
                get_def_use_mgr()->GetDef(counter_buffer_id);
            if (!IsLive(counter_buffer_inst)) {
              context()->KillInst(annotation);
              modified = true;
            }
          }
        }
        break;
      case spv::Op::OpGroupDecorate: {
        // Go through the targets of this group decorate. Remove each dead
        // target. If all targets are dead, remove this decoration.
        bool dead = true;
        bool removed_operand = false;
        for (uint32_t i = 1; i < annotation->NumOperands();) {
          Instruction* opInst =
              get_def_use_mgr()->GetDef(annotation->GetSingleWordOperand(i));
          if (!IsLive(opInst)) {
            // Don't increment |i|.
            annotation->RemoveOperand(i);
            modified = true;
            removed_operand = true;
          } else {
            i++;
            dead = false;
          }
        }
        if (dead) {
          context()->KillInst(annotation);
          modified = true;
        } else if (removed_operand) {
          context()->UpdateDefUse(annotation);
        }
        break;
      }
      case spv::Op::OpGroupMemberDecorate: {
        // Go through the targets of this group member decorate. Remove each
        // dead target (and member index). If all targets are dead, remove this
        // decoration.
        bool dead = true;
        bool removed_operand = false;
        for (uint32_t i = 1; i < annotation->NumOperands();) {
          Instruction* opInst =
              get_def_use_mgr()->GetDef(annotation->GetSingleWordOperand(i));
          if (!IsLive(opInst)) {
            // Don't increment |i|.
            annotation->RemoveOperand(i + 1);
            annotation->RemoveOperand(i);
            modified = true;
            removed_operand = true;
          } else {
            i += 2;
            dead = false;
          }
        }
        if (dead) {
          context()->KillInst(annotation);
          modified = true;
        } else if (removed_operand) {
          context()->UpdateDefUse(annotation);
        }
        break;
      }
      case spv::Op::OpDecorationGroup:
        // By the time we hit decoration groups we've checked everything that
        // can target them. So if they have no uses they must be dead.
        if (get_def_use_mgr()->NumUsers(annotation) == 0) {
          context()->KillInst(annotation);
          modified = true;
        }
        break;
      default:
        assert(false);
        break;
    }
  }

  for (auto& dbg : get_module()->ext_inst_debuginfo()) {
    if (IsLive(&dbg)) continue;
    // Save GlobalVariable if its variable is live, otherwise null out variable
    // index
    if (dbg.GetCommonDebugOpcode() == CommonDebugInfoDebugGlobalVariable) {
      auto var_id = dbg.GetSingleWordOperand(kGlobalVariableVariableIndex);
      Instruction* var_inst = get_def_use_mgr()->GetDef(var_id);
      if (IsLive(var_inst)) continue;
      context()->ForgetUses(&dbg);
      dbg.SetOperand(
          kGlobalVariableVariableIndex,
          {context()->get_debug_info_mgr()->GetDebugInfoNone()->result_id()});
      context()->AnalyzeUses(&dbg);
      continue;
    }
    to_kill_.push_back(&dbg);
    modified = true;
  }

  // Since ADCE is disabled for non-shaders, we don't check for export linkage
  // attributes here.
  for (auto& val : get_module()->types_values()) {
    if (!IsLive(&val)) {
      // Save forwarded pointer if pointer is live since closure does not mark
      // this live as it does not have a result id. This is a little too
      // conservative since it is not known if the structure type that needed
      // it is still live. TODO(greg-lunarg): Only save if needed.
      if (val.opcode() == spv::Op::OpTypeForwardPointer) {
        uint32_t ptr_ty_id = val.GetSingleWordInOperand(0);
        Instruction* ptr_ty_inst = get_def_use_mgr()->GetDef(ptr_ty_id);
        if (IsLive(ptr_ty_inst)) continue;
      }
      to_kill_.push_back(&val);
      modified = true;
    }
  }

  if (!preserve_interface_) {
    // Remove the dead interface variables from the entry point interface list.
    for (auto& entry : get_module()->entry_points()) {
      std::vector<Operand> new_operands;
      for (uint32_t i = 0; i < entry.NumInOperands(); ++i) {
        if (i < 3) {
          // Execution model, function id and name are always valid.
          new_operands.push_back(entry.GetInOperand(i));
        } else {
          auto* var =
              get_def_use_mgr()->GetDef(entry.GetSingleWordInOperand(i));
          if (IsLive(var)) {
            new_operands.push_back(entry.GetInOperand(i));
          }
        }
      }
      if (new_operands.size() != entry.NumInOperands()) {
        entry.SetInOperands(std::move(new_operands));
        get_def_use_mgr()->UpdateDefUse(&entry);
      }
    }
  }

  return modified;
}